

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  char *c_00;
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined8 uStack_38;
  char c;
  
  s->img_buffer = s->img_buffer_original;
  uStack_38 = in_RAX;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (sVar1 == 'P' && 0xfd < (byte)(sVar2 - 0x37)) {
    *comp = (uint)(sVar2 == '6') * 2 + 1;
    sVar1 = stbi__get8(s);
    c_00 = (char *)((long)&uStack_38 + 7);
    uStack_38 = CONCAT17(sVar1,(undefined7)uStack_38);
    stbi__pnm_skip_whitespace(s,c_00);
    iVar3 = stbi__pnm_getinteger(s,c_00);
    *x = iVar3;
    stbi__pnm_skip_whitespace(s,c_00);
    iVar3 = stbi__pnm_getinteger(s,c_00);
    *y = iVar3;
    stbi__pnm_skip_whitespace(s,c_00);
    iVar3 = stbi__pnm_getinteger(s,c_00);
    if (iVar3 < 0x100) {
      return 1;
    }
    stbi__g_failure_reason = "max value > 255";
  }
  else {
    s->img_buffer = s->img_buffer_original;
  }
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv;
   char c, p, t;

   stbi__rewind( s );

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}